

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::RadioEntityType::RadioEntityType(RadioEntityType *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__RadioEntityType_00324a10;
  this->m_ui8EntityKind = '\0';
  this->m_ui8Domain = '\0';
  this->m_ui16Country = 0;
  this->m_ui8Category = '\0';
  this->m_ui8NomenclatureVersion = '\0';
  this->m_ui16Nomenclature = 0;
  return;
}

Assistant:

RadioEntityType::RadioEntityType() :
    m_ui8EntityKind( 0 ),
    m_ui8Domain( 0 ),
    m_ui16Country( 0 ),
    m_ui8Category( 0 ),
    m_ui8NomenclatureVersion( 0 ),
    m_ui16Nomenclature( 0 )
{
}